

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

connectdata * cpool_get_live_conn(cpool *cpool)

{
  Curl_llist_node *n;
  connectdata *pcVar1;
  Curl_llist_node *conn_node;
  cpool_bundle *bundle;
  Curl_hash_element *he;
  Curl_hash_iterator iter;
  cpool *cpool_local;
  
  iter.current_element = (Curl_llist_node *)cpool;
  Curl_hash_start_iterate(&cpool->dest2bundle,(Curl_hash_iterator *)&he);
  bundle = (cpool_bundle *)Curl_hash_next_element((Curl_hash_iterator *)&he);
  while( true ) {
    if (bundle == (cpool_bundle *)0x0) {
      return (connectdata *)0x0;
    }
    n = Curl_llist_head((Curl_llist *)bundle->dest_len);
    if (n != (Curl_llist_node *)0x0) break;
    bundle = (cpool_bundle *)Curl_hash_next_element((Curl_hash_iterator *)&he);
  }
  pcVar1 = (connectdata *)Curl_node_elem(n);
  return pcVar1;
}

Assistant:

static struct connectdata *cpool_get_live_conn(struct cpool *cpool)
{
  struct Curl_hash_iterator iter;
  struct Curl_hash_element *he;
  struct cpool_bundle *bundle;
  struct Curl_llist_node *conn_node;

  Curl_hash_start_iterate(&cpool->dest2bundle, &iter);
  for(he = Curl_hash_next_element(&iter); he;
      he = Curl_hash_next_element(&iter)) {
    bundle = he->ptr;
    conn_node = Curl_llist_head(&bundle->conns);
    if(conn_node)
      return Curl_node_elem(conn_node);
  }
  return NULL;
}